

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result_reporter.hpp
# Opt level: O2

void iutest::detail::DefaultGlobalTestPartResultReporter::DefaultReportTestPartResult
               (TestPartResult *test_part_result)

{
  TestResult *this;
  Variable *pVVar1;
  string local_30;
  
  this = UnitTestImpl::current_test_result();
  if (this == (TestResult *)0x0) {
    iuCodeMessage::make_newline_message_abi_cxx11_(&local_30,&test_part_result->super_iuCodeMessage)
    ;
    iuConsole::output("%s",local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::push_back
              (&this->m_test_part_results,test_part_result);
  }
  pVVar1 = TestEnv::get_vars();
  TestEventRepeater::OnTestPartResult(&(pVVar1->m_event_listeners).m_repeater,test_part_result);
  return;
}

Assistant:

static void DefaultReportTestPartResult(const TestPartResult& test_part_result)
    {
        TestResult* result = UnitTestImpl::current_test_result();
        if( result )
        {
            result->AddTestPartResult(test_part_result);
        }
        else
        {
            iuConsole::output("%s", test_part_result.make_newline_message().c_str());
        }
        TestEnv::event_listeners().OnTestPartResult(test_part_result);
    }